

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileConst(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Reader source_00;
  Builder target;
  Reader type;
  ImplicitParams implicitMethodParams;
  Builder target_00;
  bool bVar1;
  Schema local_158;
  Builder local_150;
  Reader local_128;
  Reader local_f8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  Reader local_68;
  undefined1 local_38 [8];
  Builder typeBuilder;
  NodeTranslator *this_local;
  
  typeBuilder._builder._32_8_ = this;
  capnp::schema::Node::Const::Builder::initType((Builder *)local_38,&builder);
  Declaration::Const::Reader::getType(&local_68,&decl);
  memcpy(&local_90,local_38,0x28);
  noImplicitParams();
  source._reader.capTable = local_68._reader.capTable;
  source._reader.segment = local_68._reader.segment;
  source._reader.data = local_68._reader.data;
  source._reader.pointers = local_68._reader.pointers;
  source._reader.dataSize = local_68._reader.dataSize;
  source._reader.pointerCount = local_68._reader.pointerCount;
  source._reader._38_2_ = local_68._reader._38_2_;
  source._reader.nestingLimit = local_68._reader.nestingLimit;
  source._reader._44_4_ = local_68._reader._44_4_;
  target._builder.capTable = (CapTableBuilder *)uStack_88;
  target._builder.segment = (SegmentBuilder *)local_90;
  target._builder.data = (void *)local_80;
  target._builder.pointers = (WirePointer *)uStack_78;
  target._builder.dataSize = (undefined4)local_70;
  target._builder.pointerCount = local_70._4_2_;
  target._builder._38_2_ = local_70._6_2_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_c0;
  implicitMethodParams.scopeId = local_c8;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)local_b8;
  implicitMethodParams.params.reader.ptr = (byte *)uStack_b0;
  implicitMethodParams.params.reader.elementCount = (undefined4)local_a8;
  implicitMethodParams.params.reader.step = local_a8._4_4_;
  implicitMethodParams.params.reader.structDataSize = (undefined4)uStack_a0;
  implicitMethodParams.params.reader.structPointerCount = uStack_a0._4_2_;
  implicitMethodParams.params.reader.elementSize = uStack_a0._6_1_;
  implicitMethodParams.params.reader._39_1_ = uStack_a0._7_1_;
  implicitMethodParams.params.reader._40_8_ = local_98;
  bVar1 = compileType(this,source,target,implicitMethodParams);
  if (bVar1) {
    Declaration::Const::Reader::getValue(&local_f8,&decl);
    capnp::schema::Type::Builder::asReader(&local_128,(Builder *)local_38);
    capnp::schema::Node::Const::Builder::initValue(&local_150,&builder);
    Schema::Schema(&local_158);
    source_00._reader.capTable = local_f8._reader.capTable;
    source_00._reader.segment = local_f8._reader.segment;
    source_00._reader.data = local_f8._reader.data;
    source_00._reader.pointers = local_f8._reader.pointers;
    source_00._reader.dataSize = local_f8._reader.dataSize;
    source_00._reader.pointerCount = local_f8._reader.pointerCount;
    source_00._reader._38_2_ = local_f8._reader._38_2_;
    source_00._reader.nestingLimit = local_f8._reader.nestingLimit;
    source_00._reader._44_4_ = local_f8._reader._44_4_;
    type._reader.capTable = local_128._reader.capTable;
    type._reader.segment = local_128._reader.segment;
    type._reader.data = local_128._reader.data;
    type._reader.pointers = local_128._reader.pointers;
    type._reader.dataSize = local_128._reader.dataSize;
    type._reader.pointerCount = local_128._reader.pointerCount;
    type._reader._38_2_ = local_128._reader._38_2_;
    type._reader.nestingLimit = local_128._reader.nestingLimit;
    type._reader._44_4_ = local_128._reader._44_4_;
    target_00._builder.capTable = local_150._builder.capTable;
    target_00._builder.segment = local_150._builder.segment;
    target_00._builder.data = local_150._builder.data;
    target_00._builder.pointers = local_150._builder.pointers;
    target_00._builder.dataSize = local_150._builder.dataSize;
    target_00._builder.pointerCount = local_150._builder.pointerCount;
    target_00._builder._38_2_ = local_150._builder._38_2_;
    compileBootstrapValue(this,source_00,type,target_00,local_158);
  }
  return;
}

Assistant:

void NodeTranslator::compileConst(Declaration::Const::Reader decl,
                                  schema::Node::Const::Builder builder) {
  auto typeBuilder = builder.initType();
  if (compileType(decl.getType(), typeBuilder, noImplicitParams())) {
    compileBootstrapValue(decl.getValue(), typeBuilder.asReader(), builder.initValue());
  }
}